

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_string_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required)

{
  flatbuffers_uoffset_t end;
  void *buf;
  flatbuffers_uoffset_t offset;
  flatbuffers_uoffset_t local_24;
  int ret;
  flatbuffers_uoffset_t base;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  ret = required;
  base._2_2_ = id;
  _required_local = td;
  td_local._4_4_ = get_offset_field(td,id,required,&local_24);
  if ((td_local._4_4_ == 0) && (local_24 != 0)) {
    buf = _required_local->buf;
    end = _required_local->end;
    offset = read_uoffset(_required_local->buf,local_24);
    td_local._4_4_ = verify_string(buf,end,local_24,offset);
  }
  return td_local._4_4_;
}

Assistant:

int flatcc_verify_string_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_string(td->buf, td->end, base, read_uoffset(td->buf, base));
}